

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

void __thiscall Server::Private::clear(Private *this)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *pIVar4;
  Item *pIVar5;
  Item *pIVar6;
  Item *pIVar7;
  Item *pIVar8;
  Item *pIVar9;
  Item *pIVar10;
  TimerImpl *local_20;
  long local_18;
  
  Socket::Poll::clear(&this->_sockets);
  pIVar1 = &(this->_queuedTimers).endItem;
  pIVar4 = (this->_queuedTimers)._begin.item;
  if (pIVar4 != pIVar1) {
    pIVar9 = (this->_queuedTimers).freeItem;
    do {
      pIVar6 = pIVar4;
      pIVar6->prev = pIVar9;
      (this->_queuedTimers).freeItem = pIVar6;
      pIVar4 = pIVar6->next;
      pIVar9 = pIVar6;
    } while (pIVar6->next != pIVar1);
  }
  (this->_queuedTimers)._begin.item = pIVar1;
  (this->_queuedTimers).endItem.prev = (Item *)0x0;
  (this->_queuedTimers).root = (Item *)0x0;
  (this->_queuedTimers)._size = 0;
  PoolList<Server::Private::ListenerImpl>::clear(&this->_listeners);
  PoolList<Server::Private::EstablisherImpl>::clear(&this->_establishers);
  PoolList<Server::Private::ClientImpl>::clear(&this->_clients);
  pIVar2 = &(this->_timers).endItem;
  pIVar5 = (this->_timers)._begin.item;
  if (pIVar5 != pIVar2) {
    pIVar10 = (this->_timers).freeItem;
    do {
      pIVar7 = pIVar5;
      pIVar7->prev = pIVar10;
      (this->_timers).freeItem = pIVar7;
      pIVar5 = pIVar7->next;
      pIVar10 = pIVar7;
    } while (pIVar7->next != pIVar2);
  }
  (this->_timers)._begin.item = pIVar2;
  (this->_timers)._size = 0;
  (this->_timers).endItem.prev = (Item *)0x0;
  PoolList<Server::Private::Resolver>::clear(&this->_resolvers);
  pIVar3 = &(this->_closingClients).endItem;
  for (pIVar8 = (this->_closingClients)._begin.item; pIVar8 != pIVar3; pIVar8 = pIVar8->next) {
    *pIVar8->cell = (Item *)0x0;
    pIVar8->prev = (this->_closingClients).freeItem;
    (this->_closingClients).freeItem = pIVar8;
  }
  (this->_closingClients)._begin.item = pIVar3;
  (this->_closingClients).endItem.prev = (Item *)0x0;
  (this->_closingClients)._size = 0;
  local_18 = 0;
  local_20 = (TimerImpl *)0x0;
  MultiMap<long,_Server::Private::TimerImpl_*>::insert
            (&this->_queuedTimers,&(this->_queuedTimers).root,(Item *)0x0,&local_18,&local_20);
  this->_interrupted = false;
  return;
}

Assistant:

void Server::Private::clear()
{
  _sockets.clear();
  _queuedTimers.clear();
  _listeners.clear();
  _establishers.clear();
  _clients.clear();
  _timers.clear();
  _resolvers.clear();
  _closingClients.clear();
  _queuedTimers.insert(0, 0);
  _interrupted = false;
}